

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int __thiscall
MPLSParser::composePip_metadata
          (MPLSParser *this,uint8_t *buffer,int bufferSize,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  reference __x;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  uint8_t *puVar10;
  reference ppuVar11;
  const_reference pvVar12;
  pointer ppVar13;
  float fVar14;
  float fVar15;
  int pipHeight;
  int pipWidth;
  uint vPos;
  uint hPos;
  undefined1 auStack_118 [8];
  PIPParams pipParams_1;
  size_t k_1;
  size_t i_1;
  undefined8 uStack_e8;
  PIPParams pipParams;
  uint local_cc;
  uint k;
  uint i;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> blockDataAddressPos;
  uint pmtIndexListSize;
  uint pipStreamsSize;
  StreamType stream_coding_type;
  MPLSStreamInfo *si;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *__range1;
  uint mainHSize;
  uint mainVSize;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> pipStreams;
  uint32_t *lengthPos;
  BitStreamWriter writer;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *pmtIndexList_local;
  int bufferSize_local;
  uint8_t *buffer_local;
  MPLSParser *this_local;
  
  writer._24_8_ = pmtIndexList;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)&lengthPos);
  BitStreamWriter::setBuffer((BitStreamWriter *)&lengthPos,buffer,buffer + bufferSize);
  pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)buffer;
  BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x20,0);
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::vector
            ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize);
  __range1._4_4_ = 0;
  __range1._0_4_ = 0;
  __end1 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::begin(&this->m_streamInfo);
  si = (MPLSStreamInfo *)
       std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::end(&this->m_streamInfo);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
                                     *)&si), bVar4) {
    __x = __gnu_cxx::
          __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
          ::operator*(&__end1);
    bVar4 = isVideoStreamType((__x->super_M2TSStreamInfo).stream_coding_type);
    if (bVar4) {
      if (((__x->super_M2TSStreamInfo).isSecondary & 1U) == 0) {
        __range1._0_4_ = (__x->super_M2TSStreamInfo).width;
        __range1._4_4_ = (__x->super_M2TSStreamInfo).height;
      }
      else {
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                  ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize,__x);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
    ::operator++(&__end1);
  }
  sVar7 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::size
                    ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize);
  sVar8 = std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::size((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                  *)writer._24_8_);
  blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar8;
  BitStreamWriter::putBits
            ((BitStreamWriter *)&lengthPos,0x10,
             (uint)sVar7 *
             blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&k);
  for (local_cc = 0;
      local_cc <
      blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_cc = local_cc + 1) {
    for (pipParams.lumma = 0; (uint)pipParams.lumma < (uint)sVar7;
        pipParams.lumma = pipParams.lumma + 1) {
      pvVar9 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator[]
                         ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize,
                          (ulong)(uint)pipParams.lumma);
      pipParams.hOffset = (pvVar9->pipParams).lumma;
      uStack_e8._0_4_ = (pvVar9->pipParams).scaleIndex;
      uStack_e8._4_4_ = (pvVar9->pipParams).corner;
      pipParams.scaleIndex = (pvVar9->pipParams).hOffset;
      pipParams.corner = (pvVar9->pipParams).vOffset;
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x10,local_cc);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,8,pipParams.lumma);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,8,0);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,4,~pipParams.hOffset >> 0x1f);
      BitStreamWriter::putBit((BitStreamWriter *)&lengthPos,1);
      BitStreamWriter::putBit((BitStreamWriter *)&lengthPos,1);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,10,0);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,8,0);
      if ((int)pipParams.hOffset < 0) {
        BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,8,0);
      }
      else {
        BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,8,pipParams.hOffset);
      }
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x10,0);
      puVar10 = BitStream::getBuffer((BitStream *)&lengthPos);
      iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos);
      if (iVar5 < 0) {
        iVar5 = iVar5 + 7;
      }
      i_1 = (size_t)(puVar10 + (iVar5 >> 3));
      std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::push_back
                ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&k,(value_type *)&i_1);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x20,0);
    }
  }
  while (iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos), iVar5 % 0x10 != 0) {
    BitStreamWriter::putBit((BitStreamWriter *)&lengthPos,0);
  }
  k_1 = 0;
  do {
    sVar7 = std::
            vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            ::size((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    *)writer._24_8_);
    if (sVar7 <= k_1) {
      BitStreamWriter::flushBits((BitStreamWriter *)&lengthPos);
      iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos);
      if (iVar5 < 0) {
        iVar5 = iVar5 + 7;
      }
      uVar6 = my_ntohl((iVar5 >> 3) - 4);
      ((pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_M2TSStreamInfo).streamPID = uVar6;
      iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos);
      std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~vector
                ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&k);
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector
                ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize);
      return iVar5 / 8;
    }
    for (stack0xffffffffffffff00 = 0; uVar3 = stack0xffffffffffffff00,
        sVar7 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::size
                          ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize),
        uVar3 < sVar7; register0x00000000 = stack0xffffffffffffff00 + 1) {
      pvVar9 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator[]
                         ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize,
                          stack0xffffffffffffff00);
      pipParams_1.hOffset = (pvVar9->pipParams).lumma;
      auStack_118._0_4_ = (pvVar9->pipParams).scaleIndex;
      auStack_118._4_4_ = (pvVar9->pipParams).corner;
      pipParams_1.scaleIndex = (pvVar9->pipParams).hOffset;
      pipParams_1.corner = (pvVar9->pipParams).vOffset;
      iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos);
      if (iVar5 < 0) {
        iVar5 = iVar5 + 7;
      }
      uVar6 = my_ntohl(iVar5 >> 3);
      sVar7 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::size
                        ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize);
      ppuVar11 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                           ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)&k,
                            k_1 * sVar7 + stack0xffffffffffffff00);
      **ppuVar11 = uVar6;
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x10,1);
      if (k_1 == 0) {
LAB_0036491e:
        BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x20,this->IN_time);
      }
      else {
        pvVar12 = std::
                  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                  ::operator[]((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                *)writer._24_8_,k_1 - 1);
        bVar4 = std::
                map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                ::empty(pvVar12);
        if (bVar4) goto LAB_0036491e;
        pvVar12 = std::
                  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                  ::operator[]((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                *)writer._24_8_,k_1);
        _vPos = std::
                map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
                ::begin(pvVar12);
        ppVar13 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::
                  operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>
                              *)&vPos);
        BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0x20,(uint)(ppVar13->first >> 1));
      }
      pipWidth = 0;
      pipHeight = 0;
      bVar4 = PIPParams::isFullScreen((PIPParams *)auStack_118);
      if (!bVar4) {
        pipWidth = pipParams_1.scaleIndex;
        pipHeight = pipParams_1.corner;
        pvVar9 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator[]
                           ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize,
                            stack0xffffffffffffff00);
        uVar1 = (pvVar9->super_M2TSStreamInfo).width;
        fVar14 = PIPParams::getScaleCoeff((PIPParams *)auStack_118);
        pvVar9 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator[]
                           ((vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *)&mainHSize,
                            stack0xffffffffffffff00);
        uVar2 = (pvVar9->super_M2TSStreamInfo).height;
        fVar15 = PIPParams::getScaleCoeff((PIPParams *)auStack_118);
        if ((auStack_118._4_4_ == TopRight) || (auStack_118._4_4_ == BottomRight)) {
          pipWidth = ((uint)__range1 - (int)((float)uVar1 * fVar14)) - pipParams_1.scaleIndex;
        }
        if ((auStack_118._4_4_ == BottomRight) || (auStack_118._4_4_ == BottomLeft)) {
          pipHeight = (__range1._4_4_ - (int)((float)uVar2 * fVar15)) - pipParams_1.corner;
        }
      }
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0xc,pipWidth);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,0xc,pipHeight);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,4,auStack_118._0_4_);
      BitStreamWriter::putBits((BitStreamWriter *)&lengthPos,4,0);
      while (iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&lengthPos), iVar5 % 0x10 != 0
            ) {
        BitStreamWriter::putBit((BitStreamWriter *)&lengthPos,0);
      }
    }
    k_1 = k_1 + 1;
  } while( true );
}

Assistant:

int MPLSParser::composePip_metadata(uint8_t* buffer, const int bufferSize,
                                    const std::vector<PMTIndex>& pmtIndexList) const
{
    // The ID1 value and the ID2 value of the ExtensionData() shall be set to 0x0001 and 0x0001
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    const auto lengthPos = reinterpret_cast<uint32_t*>(buffer);
    writer.putBits(32, 0);  // length

    vector<MPLSStreamInfo> pipStreams;
    unsigned mainVSize = 0, mainHSize = 0;
    for (auto& si : m_streamInfo)
    {
        const StreamType stream_coding_type = si.stream_coding_type;
        if (isVideoStreamType(stream_coding_type))
        {
            if (si.isSecondary)
            {
                pipStreams.push_back(si);
            }
            else
            {
                mainHSize = si.width;
                mainVSize = si.height;
            }
        }
    }

    const auto pipStreamsSize = static_cast<unsigned>(pipStreams.size());
    const auto pmtIndexListSize = static_cast<unsigned>(pmtIndexList.size());

    writer.putBits(16, pipStreamsSize * pmtIndexListSize);
    vector<uint32_t*> blockDataAddressPos;
    for (unsigned i = 0; i < pmtIndexListSize; ++i)
    {
        for (unsigned k = 0; k < pipStreamsSize; k++)
        {
            const PIPParams pipParams = pipStreams[k].pipParams;
            // metadata_block_header[k]() {
            writer.putBits(16, i);  // ref_to_PlayItem_id
            writer.putBits(8, k);   // ref_to_secondary_video_stream_id
            writer.putBits(8, 0);   // reserved_for_future_use
            // pip_timeline_type == 1. Synchronous type of Picture-in-Picture
            writer.putBits(4, pipParams.lumma >= 0 ? 1 : 0);
            writer.putBit(1);       // is_luma_key = 0
            writer.putBit(1);       // trick_playing_flag. keep PIP windows when tricking
            writer.putBits(10, 0);  // reserved_for_word_align
            writer.putBits(8, 0);   // reserved_for_future_use
            if (pipParams.lumma >= 0)
            {                                        // is_luma_key==1b
                writer.putBits(8, pipParams.lumma);  // transparent Y pixels
            }
            else
            {
                writer.putBits(8, 0);  // reserved_for_future_use
            }
            writer.putBits(16, 0);  // reserved_for_future_use
            blockDataAddressPos.push_back(reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8));
            writer.putBits(32, 0);  // metadata_block_data_start_address
        }
    }
    while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
    for (size_t i = 0; i < pmtIndexList.size(); ++i)
    {
        for (size_t k = 0; k < pipStreams.size(); ++k)
        {
            PIPParams pipParams = pipStreams[k].pipParams;

            *(blockDataAddressPos[i * pipStreams.size() + k]) = my_htonl(writer.getBitsCount() / 8);

            writer.putBits(16, 1);  // number_of_pip_metadata_entries
            {
                if (i != 0 && !pmtIndexList[i - 1].empty())
                    writer.putBits(32, static_cast<unsigned>(pmtIndexList[i].begin()->first / 2));
                else
                    writer.putBits(32, IN_time);

                unsigned hPos = 0;
                unsigned vPos = 0;

                if (!pipParams.isFullScreen())
                {
                    hPos = pipParams.hOffset;
                    vPos = pipParams.vOffset;

                    const int pipWidth =
                        static_cast<int>(static_cast<float>(pipStreams[k].width) * pipParams.getScaleCoeff());
                    const int pipHeight =
                        static_cast<int>(static_cast<float>(pipStreams[k].height) * pipParams.getScaleCoeff());

                    if (pipParams.corner == PIPParams::PipCorner::TopRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomRight)
                        hPos = mainHSize - pipWidth - pipParams.hOffset;
                    if (pipParams.corner == PIPParams::PipCorner::BottomRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomLeft)
                        vPos = mainVSize - pipHeight - pipParams.vOffset;
                }

                writer.putBits(12, hPos);
                writer.putBits(12, vPos);

                writer.putBits(4, pipParams.scaleIndex);  // pip_scale[i]. 1 == no_scale
                writer.putBits(4, 0);                     // reserved_for_future_use
            }
            while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
        }
    }

    writer.flushBits();
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - 4);
    return writer.getBitsCount() / 8;
}